

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O1

bool __thiscall
gl3cts::TextureSwizzle::SmokeTest::fillSourceTexture
          (SmokeTest *this,size_t format_idx,size_t target_idx)

{
  undefined4 uVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  TestError *this_00;
  long lVar5;
  long lVar4;
  
  uVar1 = *(undefined4 *)(texture_targets + target_idx * 0x30 + 0x28);
  lVar5 = format_idx * 0x78;
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0xb8))(uVar1,this->m_source_tex_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0xaaa);
  if (*(int *)(&DAT_021da0c4 + lVar5) == 0x8d70) {
    if ((target_idx & 0xfffffffffffffff) == 4) {
      (**(code **)(lVar4 + 0x13c0))
                (0x8c1a,0,0,0,0,1,1,1,*(undefined4 *)(&DAT_021da0c8 + lVar5),
                 *(undefined4 *)(&DAT_021da0cc + lVar5),fillSourceTexture::rgba32ui);
      (**(code **)(lVar4 + 0xb8))(0x8c1a,0);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"BindTexture",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                      ,0xac7);
      return true;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
               ,0xac1);
  }
  else {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Invalid enum",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
               ,0xab4);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

bool SmokeTest::fillSourceTexture(size_t format_idx, size_t target_idx)
{
	static const glw::GLuint rgba32ui[4] = { 0x3fffffff, 0x7fffffff, 0xbfffffff, 0xffffffff };

	const glw::GLenum	  target		  = texture_targets[target_idx].m_target;
	const _texture_format& texture_format = texture_formats[format_idx];

	/*  */
	const glw::Functions& gl   = m_context.getRenderContext().getFunctions();
	const glw::GLvoid*	data = 0;

	/* Bind texture and FBO */
	gl.bindTexture(target, m_source_tex_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

	/* Set color */
	switch (texture_format.m_internal_format)
	{
	case GL_RGBA32UI:
		data = (const glw::GLubyte*)rgba32ui;
		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	/* Attach texture */
	switch (target)
	{
	case GL_TEXTURE_2D_ARRAY:
		gl.texSubImage3D(target, 0 /* level */, 0 /* x */, 0 /* y */, 0 /* z */, m_width, m_height, m_depth,
						 texture_format.m_format, texture_format.m_type, data);
		break;

	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	/* Unbind */
	gl.bindTexture(target, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

	/* Done */
	return true;
}